

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

void writeToFile(string *str,string *fileName)

{
  ofstream ofs;
  byte abStack_1f0 [480];
  
  std::ofstream::ofstream(&ofs,(string *)fileName,_S_out);
  if ((abStack_1f0[*(long *)(_ofs + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&ofs,(string *)str);
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
    return;
  }
  __assert_fail("!ofs.fail()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                ,0x234,"void writeToFile(const std::string &, const std::string &)");
}

Assistant:

void writeToFile( std::string const & str, std::string const & fileName )
{
  std::ofstream ofs( fileName );
  assert( !ofs.fail() );
  ofs << str;
  ofs.close();

#if defined( CLANG_FORMAT_EXECUTABLE )
  // explicitly flush std::cout, as std::system spawns a sub-process
  std::cout.flush();

  messager.message( "VulkanHppGenerator: Formatting " + fileName + " ...\n" );
  const std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" -i --style=file " + fileName;
  const int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    throw std::runtime_error( "VulkanHppGenerator: failed to format file " + fileName + " with error <" + std::to_string( ret ) + ">" );
  }
#endif
}